

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obme.h
# Opt level: O2

float obme::OBME<float>(float value)

{
  if (_OBME_MASK == (uint *)0x0) {
    obme_init();
  }
  return (float)((uint)value ^ *_OBME_MASK);
}

Assistant:

T OBME(T value)
	{
#if __cplusplus > 199711L
		static_assert(sizeof(T) <= sizeof(obme_t), "OBME can not obfuscate types greater than obme_t.");
#endif
		
		// Lazy initialization
		if(_OBME_MASK == NULL)
			obme_init();
		
		
		union {
			T value;
			obme_t integer;
		} reinterpret;
		reinterpret.integer = 0;
		reinterpret.value = value;
		reinterpret.integer ^= *_OBME_MASK;
		
		return reinterpret.value;
	}